

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

FillerParameter * __thiscall caffe::FillerParameter::New(FillerParameter *this,Arena *arena)

{
  FillerParameter *this_00;
  
  this_00 = (FillerParameter *)operator_new(0x40);
  FillerParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::FillerParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

FillerParameter* FillerParameter::New(::google::protobuf::Arena* arena) const {
  FillerParameter* n = new FillerParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}